

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O0

void sglr::drawQuadWithClientPointers(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  uint uVar1;
  uint uVar2;
  deBool dVar3;
  TestError *this;
  deInt32 coordLoc;
  deInt32 posLoc;
  deUint16 indices [6];
  float coord [8];
  float position [16];
  float hz;
  Vec3 *p1_local;
  Vec3 *p0_local;
  deUint32 program_local;
  Context *ctx_local;
  
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::z(p1);
  coord[6] = tcu::Vector<float,_3>::x(p0);
  coord[7] = tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::x(p0);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::z(p1);
  indices[2] = 0;
  indices[3] = 0;
  indices[4] = 0;
  indices[5] = 0;
  coord[0] = 0.0;
  coord[1] = 1.0;
  coord[2] = 1.0;
  coord[3] = 0.0;
  coord[4] = 1.0;
  coord[5] = 1.0;
  _coordLoc = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  uVar1 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_position");
  uVar2 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_coord");
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  while( true ) {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || ((int)uVar1 < 0)) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar1);
      (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0,coord + 6);
      if (-1 < (int)uVar2) {
        (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar2);
        (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar2,2,0x1406,0,0,indices + 2);
      }
      (*ctx->_vptr_Context[0x6a])(ctx,4,6,0x1403,&coordLoc);
      if (-1 < (int)uVar1) {
        (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar1);
      }
      if (-1 < (int)uVar2) {
        (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar2);
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrContextUtil.cpp"
             ,0x8a);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void drawQuadWithClientPointers (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	// Vertex data.
	float hz = (p0.z() + p1.z()) * 0.5f;
	float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};
	const float coord[] =
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f
	};
	const deUint16	indices[]	= { 0, 1, 2, 2, 1, 3 };

	deInt32			posLoc		= ctx.getAttribLocation(program, "a_position");
	deInt32			coordLoc	= ctx.getAttribLocation(program, "a_coord");

	ctx.useProgram(program);
	TCU_CHECK(posLoc >= 0);
	{
		ctx.enableVertexAttribArray(posLoc);
		ctx.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
	}

	if (coordLoc >= 0)
	{
		ctx.enableVertexAttribArray(coordLoc);
		ctx.vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, &coord[0]);
	}

	ctx.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	if (posLoc >= 0)
		ctx.disableVertexAttribArray(posLoc);

	if (coordLoc >= 0)
		ctx.disableVertexAttribArray(coordLoc);
}